

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__load_flip(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  int iVar4;
  uchar *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uchar *puVar14;
  uchar *puVar15;
  
  puVar3 = stbi__load_main(s,x,y,comp,req_comp);
  if ((puVar3 != (uchar *)0x0) && (stbi__vertically_flip_on_load != 0)) {
    uVar2 = *x;
    if (req_comp == 0) {
      req_comp = *comp;
    }
    uVar6 = *y >> 1;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < req_comp) {
      uVar9 = (ulong)(uint)req_comp;
    }
    lVar10 = (long)req_comp;
    uVar11 = 0;
    if (0 < (int)uVar2) {
      uVar11 = (ulong)uVar2;
    }
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar8;
    }
    iVar4 = (*y + -1) * uVar2;
    puVar5 = puVar3;
    for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      puVar14 = puVar3 + iVar4 * lVar10;
      puVar15 = puVar5;
      for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
        for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
          uVar1 = puVar15[uVar13];
          puVar15[uVar13] = puVar14[uVar13];
          puVar14[uVar13] = uVar1;
        }
        puVar14 = puVar14 + lVar10;
        puVar15 = puVar15 + lVar10;
      }
      iVar4 = iVar4 - uVar2;
      puVar5 = puVar5 + (int)uVar2 * lVar10;
    }
  }
  return puVar3;
}

Assistant:

static unsigned char *stbi__load_flip(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result = stbi__load_main(s, x, y, comp, req_comp);

   if (stbi__vertically_flip_on_load && result != NULL) {
      int w = *x, h = *y;
      int depth = req_comp ? req_comp : *comp;
      int row,col,z;
      stbi_uc temp;

      // @OPTIMIZE: use a bigger temp buffer and memcpy multiple pixels at once
      for (row = 0; row < (h>>1); row++) {
         for (col = 0; col < w; col++) {
            for (z = 0; z < depth; z++) {
               temp = result[(row * w + col) * depth + z];
               result[(row * w + col) * depth + z] = result[((h - row - 1) * w + col) * depth + z];
               result[((h - row - 1) * w + col) * depth + z] = temp;
            }
         }
      }
   }

   return result;
}